

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

int mpz_cmp_ui(__mpz_struct *u,unsigned_long v)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = u->_mp_size;
  if (iVar1 < 2) {
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        uVar2 = 0;
        uVar3 = 0;
      }
      else {
        uVar3 = *u->_mp_d;
        uVar2 = (uint)(v < uVar3);
      }
      return uVar2 - (uVar3 < v);
    }
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
mpz_cmp_ui (const mpz_t u, unsigned long v)
{
  mp_size_t usize = u->_mp_size;

  if (usize > 1)
    return 1;
  else if (usize < 0)
    return -1;
  else
    return GMP_CMP (mpz_get_ui (u), v);
}